

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapeQuad> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  mapped_type_conflict mVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  stringstream sout;
  int64_t glIdx;
  int64_t lcIdx;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd68;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd88;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd90;
  TPZIntelGen<pzshape::TPZShapeQuad> *in_stack_fffffffffffffd98;
  TPZCompMesh *in_stack_fffffffffffffda0;
  void **in_stack_fffffffffffffda8;
  TPZIntelGen<pzshape::TPZShapeQuad> *in_stack_fffffffffffffdb0;
  string local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0 [376];
  _Self local_78;
  _Self local_70;
  long local_68;
  mapped_type_conflict local_60;
  int local_54;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_30;
  long local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZIntelGen<pzshape::TPZShapeQuad>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02513558);
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513140;
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513140;
  local_50 = 0xffffffffffffffff;
  TPZManVector<long,_9>::TPZManVector
            ((TPZManVector<long,_9> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
             (long *)in_stack_fffffffffffffd90);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)(local_18 + 0xb8);
  local_54 = 0;
  while( true ) {
    if (8 < local_54) {
      return;
    }
    local_60 = 0xffffffffffffffff;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x50),(long)local_54);
    local_68 = *plVar3;
    local_70._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::find
                   (in_stack_fffffffffffffd68,(key_type_conflict1 *)0x1c0530e);
    local_78._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   (in_stack_fffffffffffffd68);
    bVar2 = std::operator!=(&local_70,&local_78);
    if (!bVar2) break;
    in_stack_fffffffffffffdb0 =
         (TPZIntelGen<pzshape::TPZShapeQuad> *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_fffffffffffffdb0,(key_type_conflict1 *)in_stack_fffffffffffffda8);
    mVar1 = *(mapped_type_conflict *)
             &(in_stack_fffffffffffffdb0->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
              super_TPZCompEl;
    local_60 = mVar1;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x50),(long)local_54);
    *plVar3 = mVar1;
    local_54 = local_54 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_200);
  poVar4 = std::operator<<(local_1f0,"ERROR in : ");
  poVar4 = std::operator<<(poVar4,
                           "TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1(TPZCompMesh &, const TPZCompElH1<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeQuad]"
                          );
  poVar4 = std::operator<<(poVar4," trying to clone the connect index: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_68);
  std::operator<<(poVar4," wich is not in mapped connect indexes!");
  std::__cxx11::stringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_220);
  plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x50),(long)local_54);
  *plVar3 = -1;
  std::__cxx11::stringstream::~stringstream(local_200);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh,
								 const TPZCompElH1<TSHAPE> &copy,
								 std::map<int64_t,int64_t> & gl2lcConMap,
								 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElH1::ClassId), 
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fh1fam(copy.fh1fam)
{
	int i;
	for(i=0;i<TSHAPE::NSides;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			fConnectIndexes[i] = -1;
			return;
		}
		fConnectIndexes[i] = lcIdx;
	}
  //TODO:NATHANFRAN
}